

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnMeanSigma_float(float *array,long npix,int nullcheck,float nullvalue,long *ngoodpix,
                     double *mean,double *sigma,int *status)

{
  long *in_RCX;
  int in_EDX;
  long in_RSI;
  float *in_RDI;
  double *in_R8;
  double *in_R9;
  float in_XMM0_Da;
  double dVar1;
  double xtemp;
  double sum2;
  double sum;
  float *value;
  long ngood;
  long ii;
  double local_58;
  double local_50;
  float *local_48;
  long local_40;
  long local_38;
  
  local_40 = 0;
  local_50 = 0.0;
  local_58 = 0.0;
  local_48 = in_RDI;
  if (in_EDX == 0) {
    for (local_38 = 0; local_40 = in_RSI, local_38 < in_RSI; local_38 = local_38 + 1) {
      dVar1 = (double)*local_48;
      local_50 = dVar1 + local_50;
      local_58 = dVar1 * dVar1 + local_58;
      local_48 = local_48 + 1;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      if ((*local_48 != in_XMM0_Da) || (NAN(*local_48) || NAN(in_XMM0_Da))) {
        local_40 = local_40 + 1;
        dVar1 = (double)*local_48;
        local_50 = dVar1 + local_50;
        local_58 = dVar1 * dVar1 + local_58;
      }
      local_48 = local_48 + 1;
    }
  }
  if (local_40 < 2) {
    if (local_40 == 1) {
      if (in_RCX != (long *)0x0) {
        *in_RCX = 1;
      }
      if (in_R8 != (double *)0x0) {
        *in_R8 = local_50;
      }
      if (in_R9 != (double *)0x0) {
        *in_R9 = 0.0;
      }
    }
    else {
      if (in_RCX != (long *)0x0) {
        *in_RCX = 0;
      }
      if (in_R8 != (double *)0x0) {
        *in_R8 = 0.0;
      }
      if (in_R9 != (double *)0x0) {
        *in_R9 = 0.0;
      }
    }
  }
  else {
    if (in_RCX != (long *)0x0) {
      *in_RCX = local_40;
    }
    local_50 = local_50 / (double)local_40;
    if (in_R8 != (double *)0x0) {
      *in_R8 = local_50;
    }
    if (in_R9 != (double *)0x0) {
      dVar1 = sqrt(-local_50 * local_50 + local_58 / (double)local_40);
      *in_R9 = dVar1;
    }
  }
  return *(int *)xtemp;
}

Assistant:

static int FnMeanSigma_float
       (float *array,       /*  2 dimensional array of image pixels */
        long npix,          /* number of pixels in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters */
   
	long *ngoodpix,     /* number of non-null pixels in the image */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */

/*
Compute mean and RMS sigma of the non-null pixels in the input array.
*/
{
	long ii, ngood = 0;
	float *value;
	double sum = 0., sum2 = 0., xtemp;

	value = array;
	    
	if (nullcheck) {
	        for (ii = 0; ii < npix; ii++, value++) {
		    if (*value != nullvalue) {
		        ngood++;
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		    }
		}
	} else {
	        ngood = npix;
	        for (ii = 0; ii < npix; ii++, value++) {
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		}
	}

	if (ngood > 1) {
		if (ngoodpix) *ngoodpix = ngood;
		xtemp = sum / ngood;
		if (mean)     *mean = xtemp;
		if (sigma)    *sigma = sqrt((sum2 / ngood) - (xtemp * xtemp));
	} else if (ngood == 1){
		if (ngoodpix) *ngoodpix = 1;
		if (mean)     *mean = sum;
		if (sigma)    *sigma = 0.0;
	} else {
		if (ngoodpix) *ngoodpix = 0;
	        if (mean)     *mean = 0.;
		if (sigma)    *sigma = 0.;
	}	    
	return(*status);
}